

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi.c
# Opt level: O0

int domore_getsock(Curl_easy *data,curl_socket_t *socks)

{
  connectdata *pcVar1;
  connectdata *conn;
  curl_socket_t *socks_local;
  Curl_easy *data_local;
  
  pcVar1 = data->conn;
  if ((pcVar1 == (connectdata *)0x0) ||
     (pcVar1->handler->domore_getsock ==
      (_func_int_Curl_easy_ptr_connectdata_ptr_curl_socket_t_ptr *)0x0)) {
    if ((pcVar1 == (connectdata *)0x0) || (pcVar1->sockfd == -1)) {
      data_local._4_4_ = 0;
    }
    else {
      *socks = pcVar1->sockfd;
      data_local._4_4_ = 0x10000;
    }
  }
  else {
    data_local._4_4_ = (*pcVar1->handler->domore_getsock)(data,pcVar1,socks);
  }
  return data_local._4_4_;
}

Assistant:

static int domore_getsock(struct Curl_easy *data, curl_socket_t *socks)
{
  struct connectdata *conn = data->conn;
  if(conn && conn->handler->domore_getsock)
    return conn->handler->domore_getsock(data, conn, socks);
  else if(conn && conn->sockfd != CURL_SOCKET_BAD) {
    /* Default is that we want to send something to the server */
    socks[0] = conn->sockfd;
    return GETSOCK_WRITESOCK(0);
  }
  return GETSOCK_BLANK;
}